

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void InterpolateRow_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,ptrdiff_t src_stride,int width,
                        int source_y_fraction)

{
  int iVar1;
  ulong uVar2;
  int y1_fraction;
  int iVar3;
  
  if (source_y_fraction == 0) {
    memcpy(dst_ptr,src_ptr,(long)(width * 2));
    return;
  }
  if (source_y_fraction == 0x80) {
    if (0 < width) {
      uVar2 = 0;
      do {
        dst_ptr[uVar2] =
             (uint16_t)((uint)src_ptr[uVar2] + (uint)src_ptr[src_stride + uVar2] + 1 >> 1);
        uVar2 = uVar2 + 1;
      } while ((uint)width != uVar2);
    }
    return;
  }
  iVar1 = 0x100 - source_y_fraction;
  if (1 < width) {
    iVar3 = 0;
    do {
      *dst_ptr = (uint16_t)
                 ((uint)src_ptr[src_stride] * source_y_fraction + (uint)*src_ptr * iVar1 >> 8);
      dst_ptr[1] = (uint16_t)
                   ((uint)src_ptr[src_stride + 1] * source_y_fraction + (uint)src_ptr[1] * iVar1 >>
                   8);
      src_ptr = src_ptr + 2;
      dst_ptr = dst_ptr + 2;
      iVar3 = iVar3 + 2;
    } while (iVar3 < width + -1);
  }
  if ((width & 1U) != 0) {
    *dst_ptr = (uint16_t)
               ((uint)src_ptr[src_stride] * source_y_fraction + iVar1 * (uint)*src_ptr >> 8);
  }
  return;
}

Assistant:

void InterpolateRow_16_C(uint16_t* dst_ptr,
                         const uint16_t* src_ptr,
                         ptrdiff_t src_stride,
                         int width,
                         int source_y_fraction) {
  int y1_fraction = source_y_fraction;
  int y0_fraction = 256 - y1_fraction;
  const uint16_t* src_ptr1 = src_ptr + src_stride;
  int x;
  if (source_y_fraction == 0) {
    memcpy(dst_ptr, src_ptr, width * 2);
    return;
  }
  if (source_y_fraction == 128) {
    HalfRow_16_C(src_ptr, src_stride, dst_ptr, width);
    return;
  }
  for (x = 0; x < width - 1; x += 2) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
    dst_ptr[1] = (src_ptr[1] * y0_fraction + src_ptr1[1] * y1_fraction) >> 8;
    src_ptr += 2;
    src_ptr1 += 2;
    dst_ptr += 2;
  }
  if (width & 1) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
  }
}